

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2.cpp
# Opt level: O0

void dfs_counts(int v)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference __a;
  int *s;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  int v_local;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&subs,(long)v);
  *pvVar3 = 1;
  pvVar4 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&G,(long)v);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(pvVar4);
  s = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar4);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &s);
    if (!bVar2) break;
    __a = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&__end1);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&par,(long)*__a);
    *pvVar3 = v;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&depth,(long)v);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&depth,(long)*__a);
    *pvVar3 = iVar1 + 1;
    dfs_counts(*__a);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&subs,(long)*__a);
    iVar1 = *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&subs,(long)v);
    *pvVar3 = iVar1 + *pvVar3;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&subs,(long)*__a);
    iVar1 = *pvVar3;
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&G,(long)v);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&subs,(long)*pvVar3);
    if (*pvVar3 < iVar1) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&G,(long)v);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
      std::swap<int>(__a,pvVar3);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void dfs_counts(int v = 0) {
	subs[v] = 1;
	for (auto &s: G[v]) {
		par[s] = v, depth[s] = depth[v] + 1;
		dfs_counts(s);
		subs[v] += subs[s];
		if (subs[s] > subs[G[v][0]]) swap(s, G[v][0]);
	}
}